

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback(CodedInputStream *this,uint32 *value)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  uint8 *end;
  uint32 *value_local;
  CodedInputStream *this_local;
  uint local_30;
  int i;
  uint32 result;
  uint32 b;
  uint8 *ptr;
  byte *local_10;
  
  iVar3 = BufferSize(this);
  if ((iVar3 < 10) &&
     ((this->buffer_end_ <= this->buffer_ || ((this->buffer_end_[-1] & 0x80) != 0)))) {
    bVar2 = ReadVarint32Slow(this,value);
    return bVar2;
  }
  pbVar4 = this->buffer_;
  _result = pbVar4 + 1;
  local_30 = *pbVar4 & 0x7f;
  if ((*pbVar4 & 0x80) != 0) {
    bVar1 = *_result;
    local_30 = (bVar1 & 0x7f) << 7 | local_30;
    _result = pbVar4 + 2;
    if ((bVar1 & 0x80) != 0) {
      bVar1 = pbVar4[2];
      local_30 = (bVar1 & 0x7f) << 0xe | local_30;
      _result = pbVar4 + 3;
      if ((bVar1 & 0x80) != 0) {
        bVar1 = pbVar4[3];
        local_30 = (bVar1 & 0x7f) << 0x15 | local_30;
        _result = pbVar4 + 4;
        if ((bVar1 & 0x80) != 0) {
          _result = pbVar4 + 5;
          bVar1 = pbVar4[4];
          local_30 = (uint)bVar1 << 0x1c | local_30;
          if ((bVar1 & 0x80) != 0) {
            for (this_local._4_4_ = 0; this_local._4_4_ < 5; this_local._4_4_ = this_local._4_4_ + 1
                ) {
              pbVar4 = _result + 1;
              bVar1 = *_result;
              _result = pbVar4;
              if ((bVar1 & 0x80) == 0) goto LAB_00140aff;
            }
            local_10 = (byte *)0x0;
            goto LAB_00140b10;
          }
        }
      }
    }
  }
LAB_00140aff:
  *value = local_30;
  local_10 = _result;
LAB_00140b10:
  if (local_10 != (byte *)0x0) {
    this->buffer_ = local_10;
  }
  return local_10 != (byte *)0x0;
}

Assistant:

bool CodedInputStream::ReadVarint32Fallback(uint32* value) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  If the varint ends at exactly the end of the buffer,
      // we can detect that and still use the fast path.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    const uint8* end = ReadVarint32FromArray(buffer_, value);
    if (end == NULL) return false;
    buffer_ = end;
    return true;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    return ReadVarint32Slow(value);
  }
}